

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_tensor_layout.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_0::ValidateTensorLayoutResultTypeNV
          (ValidationState_t *_,Instruction *inst)

{
  uint id;
  Instruction *pIVar1;
  DiagnosticStream *pDVar2;
  spv_result_t sVar3;
  char *local_220;
  string local_218;
  DiagnosticStream local_1f8;
  
  sVar3 = SPV_SUCCESS;
  id = Instruction::GetOperandAs<unsigned_int>(inst,0);
  pIVar1 = ValidationState_t::FindDef(_,id);
  if ((pIVar1 == (Instruction *)0x0) || ((pIVar1->inst_).opcode != 0x14fa)) {
    ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_ID,inst);
    local_220 = spvOpcodeString((uint)(inst->inst_).opcode);
    pDVar2 = DiagnosticStream::operator<<(&local_1f8,&local_220);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar2," Result Type <id> ",0x12);
    ValidationState_t::getIdName_abi_cxx11_(&local_218,_,id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar2,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar2," is not a tensor layout type.",0x1d);
    sVar3 = pDVar2->error_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    DiagnosticStream::~DiagnosticStream(&local_1f8);
  }
  return sVar3;
}

Assistant:

spv_result_t ValidateTensorLayoutResultTypeNV(ValidationState_t& _,
                                              const Instruction* inst) {
  const auto result_type_index = 0;
  const auto result_type_id = inst->GetOperandAs<uint32_t>(result_type_index);
  const auto result_type = _.FindDef(result_type_id);

  if (!result_type || spv::Op::OpTypeTensorLayoutNV != result_type->opcode()) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << spvOpcodeString(inst->opcode()) << " Result Type <id> "
           << _.getIdName(result_type_id) << " is not a tensor layout type.";
  }
  return SPV_SUCCESS;
}